

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O2

void __thiscall IopSpace::saveXml(IopSpace *this,ostream *s)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_38,"Should never save iop space to XML",&local_39);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void IopSpace::saveXml(ostream &s) const

{
  throw LowlevelError("Should never save iop space to XML");
}